

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_validate(bitset_container_t *v,char **reason)

{
  int iVar1;
  undefined8 *in_RSI;
  int *in_RDI;
  uint64_t *words;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  _Bool local_1;
  
  if (*(long *)(in_RDI + 2) == 0) {
    *in_RSI = "words is NULL";
    local_1 = false;
  }
  else {
    iVar2 = *in_RDI;
    iVar1 = bitset_container_compute_cardinality
                      ((bitset_container_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    if (iVar2 == iVar1) {
      if (*in_RDI < 0x1001) {
        *in_RSI = "cardinality is too small for a bitmap container";
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      *in_RSI = "cardinality is incorrect";
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool bitset_container_validate(const bitset_container_t *v, const char **reason) {
    if (v->words == NULL) {
        *reason = "words is NULL";
        return false;
    }
    if (v->cardinality != bitset_container_compute_cardinality(v)) {
        *reason = "cardinality is incorrect";
        return false;
    }
    if (v->cardinality <= DEFAULT_MAX_SIZE) {
        *reason = "cardinality is too small for a bitmap container";
        return false;
    }
    // Attempt to forcibly load the first and last words, hopefully causing
    // a segfault or an address sanitizer error if words is not allocated.
    volatile uint64_t *words = v->words;
    (void) words[0];
    (void) words[BITSET_CONTAINER_SIZE_IN_WORDS - 1];
    return true;
}